

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O3

string * __thiscall
libcellml::Importer::ImporterImpl::modelUrl_abi_cxx11_
          (string *__return_storage_ptr__,ImporterImpl *this,ModelPtr *model)

{
  element_type *peVar1;
  _Rb_tree_node_base *p_Var2;
  _Base_ptr *pp_Var3;
  _Rb_tree_node_base *p_Var4;
  _Rb_tree_header *p_Var5;
  
  p_Var2 = (this->mLibrary)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var5 = &(this->mLibrary)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var2 != p_Var5) {
    peVar1 = (model->super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    do {
      if (*(element_type **)(p_Var2 + 2) == peVar1) {
        p_Var4 = p_Var2 + 1;
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pp_Var3 = &p_Var2[1]._M_parent;
        goto LAB_0021b0d1;
      }
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2);
    } while ((_Rb_tree_header *)p_Var2 != p_Var5);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  p_Var4 = (_Rb_tree_node_base *)&libcellml::ORIGIN_MODEL_REF_abi_cxx11_;
  pp_Var3 = (_Base_ptr *)&DAT_002ecb38;
LAB_0021b0d1:
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,*(long *)p_Var4,
             (long)&(*pp_Var3)->_M_color + *(long *)p_Var4);
  return __return_storage_ptr__;
}

Assistant:

std::string Importer::ImporterImpl::modelUrl(const ModelPtr &model) const
{
    for (const auto &entry : mLibrary) {
        if (entry.second == model) {
            return entry.first;
        }
    }

    return ORIGIN_MODEL_REF;
}